

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_rgn_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  uint_fast8_t tmp;
  
  tmp = (uint_fast8_t)((ulong)in_RAX >> 0x38);
  iVar2 = -1;
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_getuint8(in,&tmp);
    if (iVar1 != 0) {
      return -1;
    }
    *(ulong *)&ms->parms = (ulong)tmp;
  }
  else {
    iVar1 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
    if (iVar1 != 0) {
      return -1;
    }
  }
  iVar1 = jpc_getuint8(in,&(ms->parms).rgn.roisty);
  if (iVar1 == 0) {
    iVar2 = jpc_getuint8(in,&(ms->parms).rgn.roishift);
    iVar2 = -(uint)(iVar2 != 0);
  }
  return iVar2;
}

Assistant:

static int jpc_rgn_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_rgn_t *rgn = &ms->parms.rgn;
	uint_fast8_t tmp;
	if (cstate->numcomps <= 256) {
		if (jpc_getuint8(in, &tmp)) {
			return -1;
		}
		rgn->compno = tmp;
	} else {
		if (jpc_getuint16(in, &rgn->compno)) {
			return -1;
		}
	}
	if (jpc_getuint8(in, &rgn->roisty) ||
	  jpc_getuint8(in, &rgn->roishift)) {
		return -1;
	}
	return 0;
}